

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall Centaurus::NFA<wchar_t>::NFA(NFA<wchar_t> *this)

{
  CharClass<wchar_t> local_40;
  NFA<wchar_t> *local_10;
  NFA<wchar_t> *this_local;
  
  local_10 = this;
  NFABase<Centaurus::NFABaseState<wchar_t,_int>_>::NFABase
            (&this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>);
  (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>)._vptr_NFABase =
       (_func_int **)&PTR__NFA_002968b8;
  std::
  vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  ::emplace_back<>(&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states);
  CharClass<wchar_t>::CharClass(&local_40);
  add_state(this,&local_40);
  CharClass<wchar_t>::~CharClass(&local_40);
  return;
}

Assistant:

NFA()
    {
        m_states.emplace_back();
        add_state(CharClass<TCHAR>());
    }